

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::flipAllBitsSlowCase(APInt *this)

{
  WordType *dst;
  uint parts;
  APInt *this_local;
  
  dst = (this->U).pVal;
  parts = getNumWords(this);
  tcComplement(dst,parts);
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::flipAllBitsSlowCase() {
  tcComplement(U.pVal, getNumWords());
  clearUnusedBits();
}